

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

int SSL_CTX_use_PrivateKey_ASN1(int pk,SSL_CTX *ctx,uchar *d,long len)

{
  int iVar1;
  UniquePtr<EVP_PKEY> pkey;
  uint8_t *p;
  
  if (len < 0) {
    iVar1 = 0;
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x1a1);
  }
  else {
    iVar1 = 0;
    p = d;
    pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         d2i_PrivateKey(pk,(EVP_PKEY **)0x0,&p,len);
    if (((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) || (p != d + len)) {
      ERR_put_error(0x10,0,0xc,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x1a8);
    }
    else {
      iVar1 = SSL_CTX_use_PrivateKey
                        (ctx,(EVP_PKEY *)
                             pkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pkey);
  }
  return iVar1;
}

Assistant:

int SSL_CTX_use_PrivateKey_ASN1(int type, SSL_CTX *ctx, const uint8_t *der,
                                size_t der_len) {
  if (der_len > LONG_MAX) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return 0;
  }

  const uint8_t *p = der;
  UniquePtr<EVP_PKEY> pkey(d2i_PrivateKey(type, NULL, &p, (long)der_len));
  if (!pkey || p != der + der_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_ASN1_LIB);
    return 0;
  }

  return SSL_CTX_use_PrivateKey(ctx, pkey.get());
}